

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_postfix(int allow_member_expr,int allow_call_expr)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *lhs;
  
  lhs = parse_primary();
  while( true ) {
    while( true ) {
      while( true ) {
        if (lhs == (CTcPrsNode *)0x0) {
          return (CTcPrsNode *)0x0;
        }
        tVar1 = (G_tok->curtok_).typ_;
        if ((int)tVar1 < 0x19) break;
        if (tVar1 == TOKT_LBRACK) {
          lhs = parse_subscript(lhs);
        }
        else if (tVar1 == TOKT_INC) {
          CTcTokenizer::next(G_tok);
          lhs = parse_inc(0,lhs);
        }
        else {
          if (tVar1 != TOKT_DEC) {
            return lhs;
          }
          CTcTokenizer::next(G_tok);
          lhs = parse_dec(0,lhs);
        }
      }
      if (tVar1 != TOKT_LPAR) break;
      if (allow_call_expr == 0) {
        return lhs;
      }
      lhs = parse_call(lhs);
    }
    if (tVar1 != TOKT_DOT) {
      return lhs;
    }
    if (allow_member_expr == 0) break;
    lhs = parse_member(lhs);
  }
  return lhs;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_postfix(int allow_member_expr,
                                         int allow_call_expr)
{
    /* parse a primary expression */
    CTcPrsNode *sub = parse_primary();
    if (sub == 0)
        return 0;

    /* keep going as long as we find postfix operators */
    for (;;)
    {
        /* check for a postfix operator */
        tc_toktyp_t op = G_tok->cur();
        switch(op)
        {
        case TOKT_LPAR:
            /* left paren - function or method call */
            if (allow_call_expr)
            {
                /* parse the function call expression */
                sub = parse_call(sub);
            }
            else
            {
                /* call expressions aren't allowed - stop here */
                return sub;
            }
            break;

        case TOKT_LBRACK:
            /* left square bracket - subscript */
            sub = parse_subscript(sub);
            break;

        case TOKT_DOT:
            /* 
             *   Dot - member selection.  If a member expression is allowed
             *   by the caller, parse it; otherwise, just return the
             *   expression up to this point.  
             */
            if (allow_member_expr)
            {
                /* 
                 *   it's allowed - parse it and continue to look for other
                 *   postfix expressions following the member expression 
                 */
                sub = parse_member(sub);
            }
            else
            {
                /* 
                 *   member expressions aren't allowed - stop here,
                 *   returning the expression up to this point 
                 */
                return sub;
            }
            break;

        case TOKT_INC:
            /* post-increment */
            G_tok->next();
            sub = parse_inc(FALSE, sub);
            break;

        case TOKT_DEC:
            /* post-decrement */
            G_tok->next();
            sub = parse_dec(FALSE, sub);
            break;
            
        default:
            /* it's not a postfix operator - return the result */
            return sub;
        }

        /* if the last parse failed, return failure */
        if (sub == 0)
            return 0;
    }
}